

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

void vera::ResampleBicubicPrecalc
               (vector<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_> *aWeight,
               int oldDim)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  double srcpixd_1;
  double srcpixd;
  int dstd;
  double scale_factor;
  int newDim;
  int oldDim_local;
  vector<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_> *aWeight_local;
  
  sVar2 = std::vector<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_>::size(aWeight);
  iVar1 = (int)sVar2;
  if (iVar1 < 2) {
    pvVar3 = std::vector<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_>::operator[]
                       (aWeight,0);
    DoCalc(pvVar3,(double)(oldDim + -1) / 2.0,oldDim);
  }
  else {
    for (srcpixd._4_4_ = 0; srcpixd._4_4_ < iVar1; srcpixd._4_4_ = srcpixd._4_4_ + 1) {
      pvVar3 = std::vector<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_>::operator[]
                         (aWeight,(long)srcpixd._4_4_);
      DoCalc(pvVar3,(double)srcpixd._4_4_ * ((double)(oldDim + -1) / (double)(iVar1 + -1)),oldDim);
    }
  }
  return;
}

Assistant:

void ResampleBicubicPrecalc(std::vector<BicubicPrecalc> &aWeight, int oldDim) {
    const int newDim = aWeight.size();
    // wxASSERT( oldDim > 0 && newDim > 0 );
    if ( newDim > 1 ) {
        // We want to map pixels in the range [0..newDim-1]
        // to the range [0..oldDim-1]
        const double scale_factor = static_cast<double>(oldDim-1) / (newDim-1);
        for ( int dstd = 0; dstd < newDim; dstd++ ) {
            // We need to calculate the source pixel to interpolate from - Y-axis
            const double srcpixd = static_cast<double>(dstd) * scale_factor;
            DoCalc(aWeight[dstd], srcpixd, oldDim);
        }
    }
    else {
        // Let's take the pixel from the center of the source image.
        const double srcpixd = static_cast<double>(oldDim - 1) / 2.0;
        DoCalc(aWeight[0], srcpixd, oldDim);
    }
}